

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

int PAL_iswspace(char16_t c)

{
  int iVar1;
  int ret;
  char16_t c_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  iVar1 = proxy_iswspace(c);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return iVar1;
}

Assistant:

int
__cdecl
PAL_iswspace(char16_t c)
{
    int ret;

    PERF_ENTRY(iswspace);
    ENTRY("PAL_iswspace (c=%C)\n", c);

    ret = proxy_iswspace(c);

    LOGEXIT("PAL_iswspace returns int %d\n", ret);
    PERF_EXIT(iswspace);
    return ret;
}